

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadDsd.c
# Opt level: O1

Abc_Obj_t * Io_ReadDsd_rec(Abc_Ntk_t *pNtk,char *pCur,char *pSop)

{
  char cVar1;
  uint nVars;
  Abc_Obj_t *pAVar2;
  size_t sVar3;
  Abc_Obj_t *pAVar4;
  char *pSop_00;
  ulong uVar5;
  char *pcVar6;
  int TypeExor;
  char *pParts [32];
  int local_13c;
  char *local_138 [33];
  
  cVar1 = *pCur;
  if (cVar1 == '(') {
    sVar3 = strlen(pCur);
    if (pCur[sVar3 - 1] != ')') {
      __assert_fail("pCur[strlen(pCur)-1] == \')\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadDsd.c"
                    ,0x9e,"Abc_Obj_t *Io_ReadDsd_rec(Abc_Ntk_t *, char *, char *)");
    }
    pCur[sVar3 - 1] = '\0';
    nVars = Io_ReadDsdStrSplit(pCur + 1,local_138,&local_13c);
    if (nVars != 0) {
      pAVar2 = Abc_NtkCreateObj(pNtk,ABC_OBJ_NODE);
      if (pSop == (char *)0x0) {
        if (0 < (int)nVars) {
          uVar5 = 0;
          do {
            pAVar4 = Io_ReadDsd_rec(pNtk,local_138[uVar5],(char *)0x0);
            if (pAVar4 == (Abc_Obj_t *)0x0) {
              return (Abc_Obj_t *)0x0;
            }
            Abc_ObjAddFanin(pAVar2,pAVar4);
            uVar5 = uVar5 + 1;
          } while (nVars != uVar5);
        }
      }
      else if (0 < (int)nVars) {
        uVar5 = 0;
        do {
          pAVar4 = Io_ReadDsd_rec(pNtk,local_138[uVar5],(char *)0x0);
          if (pAVar4 == (Abc_Obj_t *)0x0) {
            return (Abc_Obj_t *)0x0;
          }
          Abc_ObjAddFanin(pAVar2,pAVar4);
          uVar5 = uVar5 + 1;
        } while (nVars != uVar5);
      }
      if (pSop == (char *)0x0) {
        if (local_13c == 0) {
          pcVar6 = Abc_SopCreateAnd((Mem_Flex_t *)pNtk->pManFunc,nVars,(int *)0x0);
        }
        else {
          pcVar6 = Abc_SopCreateXorSpecial((Mem_Flex_t *)pNtk->pManFunc,nVars);
        }
      }
      else {
        pcVar6 = Abc_SopRegister((Mem_Flex_t *)pNtk->pManFunc,pSop);
      }
      (pAVar2->field_5).pData = pcVar6;
      return pAVar2;
    }
    Abc_NtkDelete(pNtk);
  }
  else {
    if (cVar1 == '!') {
      pAVar2 = Io_ReadDsd_rec(pNtk,pCur + 1,(char *)0x0);
      pAVar2 = Abc_NtkCreateNodeInv(pNtk,pAVar2);
      return pAVar2;
    }
    if ((byte)(cVar1 + 0x9fU) < 0x1a) {
      if (pCur[1] != '\0') {
        __assert_fail("*(pCur+1) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadDsd.c"
                      ,0xc6,"Abc_Obj_t *Io_ReadDsd_rec(Abc_Ntk_t *, char *, char *)");
      }
      if ('`' < cVar1) {
        if ((int)((int)cVar1 - 0x61U) < pNtk->vPis->nSize) {
          return (Abc_Obj_t *)pNtk->vPis->pArray[(int)cVar1 - 0x61U];
        }
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pcVar6 = pCur + -1;
    do {
      cVar1 = pcVar6[1];
      pcVar6 = pcVar6 + 1;
    } while ((byte)(cVar1 + 0xbfU) < 6 || (byte)(cVar1 - 0x30U) < 10);
    if (cVar1 == '(') {
      *pcVar6 = '\0';
      pSop_00 = Abc_SopFromTruthHex(pCur);
      *pcVar6 = '(';
      pAVar2 = Io_ReadDsd_rec(pNtk,pcVar6,pSop_00);
      if (pSop_00 == (char *)0x0) {
        return pAVar2;
      }
      free(pSop_00);
      return pAVar2;
    }
    puts("Cannot find the end of hexidecimal truth table.");
  }
  return (Abc_Obj_t *)0x0;
}

Assistant:

Abc_Obj_t * Io_ReadDsd_rec( Abc_Ntk_t * pNtk, char * pCur, char * pSop )
{
    Abc_Obj_t * pObj, * pFanin;
    char * pEnd, * pParts[32];
    int i, nParts, TypeExor;

    // consider complemented formula
    if ( *pCur == '!' )
    {
        pObj = Io_ReadDsd_rec( pNtk, pCur + 1, NULL );
        return Abc_NtkCreateNodeInv( pNtk, pObj );
    }
    if ( *pCur == '(' )
    {
        assert( pCur[strlen(pCur)-1] == ')' );
        pCur[strlen(pCur)-1] = 0;
        nParts = Io_ReadDsdStrSplit( pCur+1, pParts, &TypeExor );
        if ( nParts == 0 )
        {
            Abc_NtkDelete( pNtk );
            return NULL;
        }
        pObj = Abc_NtkCreateNode( pNtk );
        if ( pSop )
        {
//            for ( i = nParts - 1; i >= 0; i-- )
            for ( i = 0; i < nParts; i++ )
            {
                pFanin = Io_ReadDsd_rec( pNtk, pParts[i], NULL );
                if ( pFanin == NULL )
                    return NULL;
                Abc_ObjAddFanin( pObj, pFanin );
            }
        }
        else
        {
            for ( i = 0; i < nParts; i++ )
            {
                pFanin = Io_ReadDsd_rec( pNtk, pParts[i], NULL );
                if ( pFanin == NULL )
                    return NULL;
                Abc_ObjAddFanin( pObj, pFanin );
            }
        }
        if ( pSop )
            pObj->pData = Abc_SopRegister( (Mem_Flex_t *)pNtk->pManFunc, pSop );
        else if ( TypeExor )
            pObj->pData = Abc_SopCreateXorSpecial( (Mem_Flex_t *)pNtk->pManFunc, nParts );
        else
            pObj->pData = Abc_SopCreateAnd( (Mem_Flex_t *)pNtk->pManFunc, nParts, NULL );
        return pObj;
    }
    if ( *pCur >= 'a' && *pCur <= 'z' )
    {
        assert( *(pCur+1) == 0 );
        return Abc_NtkPi( pNtk, *pCur - 'a' );
    }

    // skip hex truth table
    pEnd = pCur;
    while ( (*pEnd >= '0' && *pEnd <= '9') || (*pEnd >= 'A' && *pEnd <= 'F') )
        pEnd++;
    if ( *pEnd != '(' )
    {
        printf( "Cannot find the end of hexidecimal truth table.\n" );
        return NULL;
    }

    // parse the truth table
    *pEnd = 0;
    pSop = Abc_SopFromTruthHex( pCur );
    *pEnd = '(';
    pObj = Io_ReadDsd_rec( pNtk, pEnd, pSop );
    ABC_FREE( pSop );
    return pObj;
}